

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

int CompareMeshPoint(void *a,void *b,void *ptr)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  double dVar5;
  double dk;
  int u;
  int j;
  int i;
  tagMESHPOINTS *mp;
  float d;
  void *ptr_local;
  void *b_local;
  void *a_local;
  
  iVar1 = (int)a - (int)*ptr;
  iVar2 = (int)b - (int)*ptr;
  mp._4_4_ = *(float *)(*(long *)((long)ptr + 8) + (long)iVar2 * 0xc) -
             *(float *)(*(long *)((long)ptr + 8) + (long)iVar1 * 0xc);
  if ((mp._4_4_ == 0.0) && (!NAN(mp._4_4_))) {
    mp._4_4_ = *(float *)(*(long *)((long)ptr + 8) + (long)iVar2 * 0xc + 4) -
               *(float *)(*(long *)((long)ptr + 8) + (long)iVar1 * 0xc + 4);
    if ((mp._4_4_ == 0.0) && (!NAN(mp._4_4_))) {
      mp._4_4_ = *(float *)(*(long *)((long)ptr + 8) + (long)iVar2 * 0xc + 8) -
                 *(float *)(*(long *)((long)ptr + 8) + (long)iVar1 * 0xc + 8);
      if (((mp._4_4_ == 0.0) && (!NAN(mp._4_4_))) && (*(long *)((long)ptr + 0x18) != 0)) {
        mp._4_4_ = *(float *)(*(long *)((long)ptr + 0x18) + (long)iVar2 * 0xc) -
                   *(float *)(*(long *)((long)ptr + 0x18) + (long)iVar1 * 0xc);
        if ((mp._4_4_ == 0.0) && (!NAN(mp._4_4_))) {
          mp._4_4_ = *(float *)(*(long *)((long)ptr + 0x18) + (long)iVar2 * 0xc + 4) -
                     *(float *)(*(long *)((long)ptr + 0x18) + (long)iVar1 * 0xc + 4);
          if ((mp._4_4_ == 0.0) && (!NAN(mp._4_4_))) {
            mp._4_4_ = *(float *)(*(long *)((long)ptr + 0x18) + (long)iVar2 * 0xc + 8) -
                       *(float *)(*(long *)((long)ptr + 0x18) + (long)iVar1 * 0xc + 8);
          }
        }
      }
      if (((mp._4_4_ == 0.0) && (!NAN(mp._4_4_))) && (*(long *)((long)ptr + 0x10) != 0)) {
        mp._4_4_ = *(float *)(*(long *)((long)ptr + 0x10) + (long)iVar2 * 8) -
                   *(float *)(*(long *)((long)ptr + 0x10) + (long)iVar1 * 8);
        if ((mp._4_4_ == 0.0) && (!NAN(mp._4_4_))) {
          mp._4_4_ = *(float *)(*(long *)((long)ptr + 0x10) + 4 + (long)iVar2 * 8) -
                     *(float *)(*(long *)((long)ptr + 0x10) + 4 + (long)iVar1 * 8);
        }
      }
      if (((mp._4_4_ == 0.0) && (!NAN(mp._4_4_))) && (*(long *)((long)ptr + 0x28) != 0)) {
        uVar3 = ON_Color::operator_cast_to_unsigned_int
                          ((ON_Color *)(*(long *)((long)ptr + 0x28) + (long)iVar2 * 4));
        uVar4 = ON_Color::operator_cast_to_unsigned_int
                          ((ON_Color *)(*(long *)((long)ptr + 0x28) + (long)iVar1 * 4));
        if ((int)(uVar3 - uVar4) < 0) {
          mp._4_4_ = -1.0;
        }
        else if (0 < (int)(uVar3 - uVar4)) {
          mp._4_4_ = 1.0;
        }
      }
      if (((mp._4_4_ == 0.0) && (!NAN(mp._4_4_))) && (*(long *)((long)ptr + 0x20) != 0)) {
        dVar5 = *(double *)(*(long *)((long)ptr + 0x20) + (long)iVar2 * 0x10) -
                *(double *)(*(long *)((long)ptr + 0x20) + (long)iVar1 * 0x10);
        if (0.0 <= dVar5) {
          if (dVar5 <= 0.0) {
            dVar5 = *(double *)(*(long *)((long)ptr + 0x20) + (long)iVar2 * 0x10 + 8) -
                    *(double *)(*(long *)((long)ptr + 0x20) + (long)iVar1 * 0x10 + 8);
            if (0.0 <= dVar5) {
              if (0.0 < dVar5) {
                mp._4_4_ = 1.0;
              }
            }
            else {
              mp._4_4_ = -1.0;
            }
          }
          else {
            mp._4_4_ = 1.0;
          }
        }
        else {
          mp._4_4_ = -1.0;
        }
      }
    }
  }
  if (0.0 <= mp._4_4_) {
    if (mp._4_4_ <= 0.0) {
      a_local._4_4_ = 0;
    }
    else {
      a_local._4_4_ = 1;
    }
  }
  else {
    a_local._4_4_ = -1;
  }
  return a_local._4_4_;
}

Assistant:

static int CompareMeshPoint(const void* a,const void* b,void* ptr)
{
  float d;
  const struct tagMESHPOINTS * mp = (const struct tagMESHPOINTS *)ptr;

  // use bogus pointer to convert a,b into vertex indices
  int i = (int)(((const char*)a) - mp->p0); // the (int) is for 64 bit size_t conversion
  int j = (int)(((const char*)b) - mp->p0);

  d = mp->V[j].x - mp->V[i].x;
  if ( d == 0.0f )
  {
    d = mp->V[j].y - mp->V[i].y;
    if ( d == 0.0f )
    {
      d = mp->V[j].z - mp->V[i].z;

      //if ( d == 0.0f )
      //  return 0;

      if ( d == 0.0f && 0 != mp->N)
      {
        d = mp->N[j].x - mp->N[i].x;
        if ( d == 0.0f )
        {
          d = mp->N[j].y - mp->N[i].y;
          if ( d == 0.0f )
          {
            d = mp->N[j].z - mp->N[i].z;
          }
        }
      }

      if ( d == 0.0f && 0 != mp->T)
      {
        d = mp->T[j].x - mp->T[i].x;
        if ( d == 0.0f )
        {
          d = mp->T[j].y - mp->T[i].y;
        }
      }

      if ( d == 0.0f && 0 != mp->C )
      {
        int u = ((int)mp->C[j])-((int)mp->C[i]);
        if ( u < 0 )
          d = -1.0f;
        else if ( u > 0 )
          d = 1.0f;
      }

      if ( d == 0.0f && 0 != mp->K )
      {
        double dk = mp->K[j].k1 - mp->K[i].k1;
        if ( dk < 0.0 )
          d = -1.0;
        else if ( dk > 0.0 )
          d = 1.0;
        else
        {
          dk = mp->K[j].k2 - mp->K[i].k2;
          if ( dk < 0.0 )
            d = -1.0;
          else if ( dk > 0.0 )
            d = 1.0;
        }
      }
    }
  }
  
  if ( d < 0.0f )
    return -1;
  if ( d > 0.0f )
    return 1;
  return 0;
}